

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O2

REF_STATUS ref_geom_remove_without_cell(REF_GRID ref_grid,REF_INT node)

{
  int geom;
  int iVar1;
  REF_GEOM ref_geom;
  REF_ADJ pRVar2;
  REF_ADJ pRVar3;
  REF_INT RVar4;
  uint uVar5;
  REF_ADJ_ITEM pRVar6;
  long lVar7;
  undefined8 uVar8;
  char *pcVar9;
  bool bVar10;
  
  ref_geom = ref_grid->geom;
  pRVar2 = ref_geom->ref_adj;
  RVar4 = -1;
  if ((-1 < node) && (node < pRVar2->nnode)) {
    RVar4 = pRVar2->first[(uint)node];
  }
  do {
    if (RVar4 == -1) {
      return 0;
    }
    pRVar6 = pRVar2->item + RVar4;
    geom = pRVar6->ref;
    iVar1 = ref_geom->descr[(long)geom * 6];
    if (iVar1 == 0) goto LAB_00143655;
    if (iVar1 != 1) {
      if (iVar1 != 2) {
        pcVar9 = "can\'t to geom type yet";
        uVar5 = 6;
        uVar8 = 0x27a;
LAB_001436ce:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               uVar8,"ref_geom_remove_without_cell",(ulong)uVar5,pcVar9);
        return uVar5;
      }
      bVar10 = false;
      for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
        if ((-1 < node) && (!bVar10)) {
          pRVar3 = ref_grid->cell[lVar7 + 3]->ref_adj;
          if (node < pRVar3->nnode) {
            bVar10 = pRVar3->first[(uint)node] != -1;
          }
          else {
            bVar10 = false;
          }
        }
      }
      if (!bVar10) {
        uVar5 = ref_geom_remove(ref_geom,geom);
        if (uVar5 != 0) {
          pcVar9 = "remove";
          uVar8 = 0x275;
          goto LAB_001436ce;
        }
        goto LAB_00143637;
      }
      goto LAB_00143655;
    }
    bVar10 = false;
    for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
      if ((-1 < node) && (!bVar10)) {
        pRVar3 = ref_grid->cell[lVar7]->ref_adj;
        if (node < pRVar3->nnode) {
          bVar10 = pRVar3->first[(uint)node] != -1;
        }
        else {
          bVar10 = false;
        }
      }
    }
    if (bVar10) goto LAB_00143655;
    uVar5 = ref_geom_remove(ref_geom,geom);
    if (uVar5 != 0) {
      pcVar9 = "remove";
      uVar8 = 0x268;
      goto LAB_001436ce;
    }
LAB_00143637:
    RVar4 = -1;
    if ((-1 < node) && (RVar4 = -1, node < pRVar2->nnode)) {
      pRVar6 = (REF_ADJ_ITEM)(pRVar2->first + (uint)node);
LAB_00143655:
      RVar4 = pRVar6->next;
    }
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_geom_remove_without_cell(REF_GRID ref_grid,
                                                REF_INT node) {
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_ADJ ref_adj = ref_geom_adj(ref_geom);
  REF_CELL ref_cell;
  REF_INT type, item, geom, group;
  REF_BOOL supported_by_cell;

  item = ref_adj_first(ref_adj, node);
  while (ref_adj_valid(item)) {
    geom = ref_adj_item_ref(ref_adj, item);
    type = ref_geom_type(ref_geom, geom);
    switch (type) {
      case REF_GEOM_NODE:
        item = ref_adj_item_next(ref_adj, item);
        break;
      case REF_GEOM_EDGE:
        supported_by_cell = REF_FALSE;
        each_ref_grid_edge_ref_cell(ref_grid, group, ref_cell) {
          supported_by_cell =
              (supported_by_cell || !ref_cell_node_empty(ref_cell, node));
        }
        if (supported_by_cell) {
          item = ref_adj_item_next(ref_adj, item);
        } else {
          RSS(ref_geom_remove(ref_geom, geom), "remove");
          item = ref_adj_first(ref_adj, node);
        }
        break;
      case REF_GEOM_FACE:
        supported_by_cell = REF_FALSE;
        each_ref_grid_face_ref_cell(ref_grid, group, ref_cell) {
          supported_by_cell =
              (supported_by_cell || !ref_cell_node_empty(ref_cell, node));
        }
        if (supported_by_cell) {
          item = ref_adj_item_next(ref_adj, item);
        } else {
          RSS(ref_geom_remove(ref_geom, geom), "remove");
          item = ref_adj_first(ref_adj, node);
        }
        break;
      default:
        RSS(REF_IMPLEMENT, "can't to geom type yet");
    }
  }

  return REF_SUCCESS;
}